

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyDepthBoundsTest
          (UncommittedRegionsAccessTestCase *this,Functions *gl,ShaderProgram *program,GLint width,
          GLint height,GLint widthCommitted)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  allocator<char> local_12a;
  allocator<char> local_129;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dataDepth;
  string local_f8;
  VertexArrayBinding vertexArrays [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&dataDepth,"vertex",&local_129);
  glu::va::Float(vertexArrays,(string *)&dataDepth,3,4,0,(float *)gl4cts::vertices);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"inTexCoord",&local_12a);
  glu::va::Float(vertexArrays + 1,&local_f8,2,4,0,(float *)gl4cts::texCoord);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&dataDepth);
  std::operator<<((ostream *)
                  &(this->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.field_0x88,"Perform Depth Bounds Test - ");
  (*gl->clear)(0x4500);
  (*gl->enable)(0x8890);
  (*gl->depthFunc)(0x201);
  dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_600000001;
  dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,2);
  dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)gl4cts::indices;
  glu::draw(((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             super_TestCase.m_context)->m_renderCtx,(program->m_program).m_program,2,vertexArrays,
            (PrimitiveList *)&dataDepth,(DrawUtilCallback *)0x0);
  dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&dataDepth,(long)(height * width));
  puVar1 = dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  (*gl->readPixels)(0,0,width,height,0x1902,0x1405,
                    dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  if (0 < height) {
    uVar5 = (ulong)(uint)height;
  }
  do {
    lVar3 = uVar5 + 1;
    iVar2 = widthCommitted;
    if (width <= widthCommitted) {
      (*gl->disable)(0x8890);
LAB_00adcf1e:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      lVar3 = 0x58;
      do {
        std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar3));
        lVar3 = lVar3 + -0x50;
      } while (lVar3 != -0x48);
      return width <= widthCommitted;
    }
    while (lVar3 = lVar3 + -1, lVar3 != 0) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + width;
      if (puVar1[lVar4] != 0xffffffff) {
        (*gl->disable)(0x8890);
        goto LAB_00adcf1e;
      }
    }
    widthCommitted = widthCommitted + 1;
  } while( true );
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyDepthBoundsTest(const Functions& gl, ShaderProgram& program, GLint width,
															 GLint height, GLint widthCommitted)
{
	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("vertex", 3, 4, 0, vertices),
											   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	mLog << "Perform Depth Bounds Test - ";

	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_BOUNDS_TEST_EXT);
	gl.depthFunc(GL_LESS);

	glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indices), indices));

	std::vector<GLuint> dataDepth;
	dataDepth.resize(width * height);
	GLuint* dataDepthPtr = dataDepth.data();

	gl.readPixels(0, 0, width, height, GL_DEPTH_COMPONENT, GL_UNSIGNED_INT, (GLvoid*)dataDepthPtr);
	for (int x = widthCommitted; x < width; ++x)
		for (int y = 0; y < height; ++y)
		{
			if (dataDepthPtr[x + y * width] != 0xFFFFFFFF)
			{
				gl.disable(GL_DEPTH_BOUNDS_TEST_EXT);
				return false;
			}
		}

	gl.disable(GL_DEPTH_BOUNDS_TEST_EXT);
	return true;
}